

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

void __thiscall
QGles2Buffer::fullDynamicBufferUpdateForCurrentFrame
          (QGles2Buffer *this,void *bufferData,quint32 size)

{
  QRhiImplementation *pQVar1;
  Data *pDVar2;
  
  if (size == 0) {
    size = (this->super_QRhiBuffer).m_size;
  }
  if (((this->super_QRhiBuffer).m_usage.super_QFlagsStorageHelper<QRhiBuffer::UsageFlag,_4>.
       super_QFlagsStorage<QRhiBuffer::UsageFlag>.i & 4) == 0) {
    pQVar1 = (this->super_QRhiBuffer).super_QRhiResource.m_rhi;
    (**(code **)(*pQVar1[1].resUpdPool.super_QVLABase<QRhiResourceUpdateBatch_*>.super_QVLABaseBase.
                  ptr + 400))(this->targetForDataOps,this->buffer);
    (**(code **)(*pQVar1[1].resUpdPool.super_QVLABase<QRhiResourceUpdateBatch_*>.super_QVLABaseBase.
                  ptr + 0x1d0))(this->targetForDataOps,0,size,bufferData);
    return;
  }
  pDVar2 = (this->data).d.d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)&this->data,(AllocationOption)(this->data).d.size);
  }
  memcpy((this->data).d.ptr,bufferData,(ulong)size);
  return;
}

Assistant:

void QGles2Buffer::fullDynamicBufferUpdateForCurrentFrame(const void *bufferData, quint32 size)
{
    const quint32 copySize = size > 0 ? size : m_size;
    if (!m_usage.testFlag(UniformBuffer)) {
        QRHI_RES_RHI(QRhiGles2);
        rhiD->f->glBindBuffer(targetForDataOps, buffer);
        rhiD->f->glBufferSubData(targetForDataOps, 0, copySize, bufferData);
    } else {
        memcpy(data.data(), bufferData, copySize);
    }
}